

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O0

void test_1(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChStreamOutAscii *pCVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  ChVector<double> *pCVar9;
  ChVector<double> local_540;
  shared_ptr<chrono::ChSolver> local_528;
  undefined1 local_518 [8];
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::ChBodyFrame> local_4f8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_4e8;
  undefined1 local_4d8 [8];
  shared_ptr<chrono::fea::ChLinkPointFrame> constraintA;
  undefined1 local_4b8 [8];
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChElementBase> local_498;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_488;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_478;
  undefined1 local_468 [8];
  shared_ptr<chrono::fea::ChElementSpring> melementA;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_448;
  ChVector<double> local_438;
  ChVector<double> local_420;
  undefined1 local_408 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeB;
  undefined1 local_3e0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeA;
  undefined1 local_3c0 [8];
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  ChSystemSMC sys;
  
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar2,"\n-------------------------------------------------\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"TEST: spring element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,true);
  chrono_types::make_shared<chrono::fea::ChMesh,_0>();
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_3e0);
  chrono::ChVector<double>::ChVector(&local_420,0.0,1.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_408);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3e0);
  (**(code **)(*(long *)peVar3 + 0x50))(0x3f847ae147ae147b);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_408);
  (**(code **)(*(long *)peVar3 + 0x50))(0x3f847ae147ae147b);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_408);
  chrono::ChVector<double>::ChVector(&local_438,0.0,5.0,0.0);
  (**(code **)(*(long *)peVar3 + 0x68))(peVar3,&local_438);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (&local_448,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3e0);
  chrono::fea::ChMesh::AddNode(peVar4,&local_448);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_448);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  p_Var1 = &melementA.super___shared_ptr<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)p_Var1,
             (shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_408);
  chrono::fea::ChMesh::AddNode(peVar4,p_Var1);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)
             &melementA.super___shared_ptr<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  chrono_types::make_shared<chrono::fea::ChElementSpring,_0>();
  peVar5 = std::
           __shared_ptr_access<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_468);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_478,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3e0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_488,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_408);
  (**(code **)(*(long *)peVar5 + 0xb0))(peVar5,&local_478,&local_488);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_488);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_478);
  peVar5 = std::
           __shared_ptr_access<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementSpring,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_468);
  (**(code **)(*(long *)peVar5 + 0xb8))(0x40f86a0000000000);
  peVar4 = std::__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3c0);
  std::shared_ptr<chrono::fea::ChElementBase>::shared_ptr<chrono::fea::ChElementSpring,void>
            (&local_498,(shared_ptr<chrono::fea::ChElementSpring> *)local_468);
  chrono::fea::ChMesh::AddElement(peVar4,&local_498);
  std::shared_ptr<chrono::fea::ChElementBase>::~shared_ptr(&local_498);
  p_Var1 = &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChMesh,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChMesh> *)local_3c0);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono_types::make_shared<chrono::ChBody,_0>();
  peVar6 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_4b8);
  chrono::ChBody::SetBodyFixed(SUB81(peVar6,0));
  p_Var1 = &constraintA.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBody,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,(shared_ptr<chrono::ChBody> *)local_4b8);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &constraintA.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4d8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_4e8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3e0);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (&local_4f8,(shared_ptr<chrono::ChBody> *)local_4b8);
  (**(code **)(*(long *)peVar7 + 0x220))(peVar7,&local_4e8,&local_4f8,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_4f8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_4e8);
  p_Var1 = &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)p_Var1,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)local_4d8);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,p_Var1);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::ChSolverMINRES,_0>();
  std::shared_ptr<chrono::ChSolver>::shared_ptr<chrono::ChSolverMINRES,void>
            (&local_528,(shared_ptr<chrono::ChSolverMINRES> *)local_518);
  chrono::ChSystem::SetSolver
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_528);
  std::shared_ptr<chrono::ChSolver>::~shared_ptr(&local_528);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_518);
  chrono::ChIterativeSolver::SetMaxIterations((ChIterativeSolver *)peVar8,0x28);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_518);
  chrono::ChIterativeSolver::SetTolerance((ChIterativeSolver *)peVar8,1e-10);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_518);
  chrono::ChIterativeSolver::EnableDiagonalPreconditioner((ChIterativeSolver *)peVar8,true);
  peVar8 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_518);
  chrono::ChSolver::SetVerbose((ChSolver *)(peVar8 + 0x18),true);
  chrono::ChSystem::DoStaticLinear();
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"poss after linear static analysis: \n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"  nodeA->pos \n");
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3e0);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  chrono::operator<<(pCVar2,pCVar9);
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"  nodeB->pos \n");
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_408);
  pCVar9 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar3 + 0x18));
  chrono::operator<<(pCVar2,pCVar9);
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"Forces after linear static analysis: \n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"  constraintA.react \n")
  ;
  peVar7 = std::
           __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4d8);
  chrono::fea::ChLinkPointFrame::GetReactionOnBody(&local_540,peVar7);
  chrono::operator<<(pCVar2,&local_540);
  std::shared_ptr<chrono::ChSolverMINRES>::~shared_ptr
            ((shared_ptr<chrono::ChSolverMINRES> *)local_518);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)local_4d8);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)local_4b8);
  std::shared_ptr<chrono::fea::ChElementSpring>::~shared_ptr
            ((shared_ptr<chrono::fea::ChElementSpring> *)local_468);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_408);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_3e0);
  std::shared_ptr<chrono::fea::ChMesh>::~shared_ptr((shared_ptr<chrono::fea::ChMesh> *)local_3c0);
  chrono::ChSystemSMC::~ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void test_1() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: spring element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    auto mnodeA = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnodeB = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 1, 0));

    // For example, you can attach local 'point masses' (FE node masses are zero by default)
    mnodeA->SetMass(0.01);
    mnodeB->SetMass(0.01);

    // For example, set an applied force to a node:
    mnodeB->SetForce(ChVector<>(0, 5, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnodeA);
    my_mesh->AddNode(mnodeB);

    // Create some elements of 'spring-damper' type, each connecting
    // two 3D nodes:
    auto melementA = chrono_types::make_shared<ChElementSpring>();
    melementA->SetNodes(mnodeA, mnodeB);
    melementA->SetSpringK(100000);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melementA);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    truss->SetBodyFixed(true);
    sys.Add(truss);

    // Create a constraint between a node and the truss
    auto constraintA = chrono_types::make_shared<ChLinkPointFrame>();

    constraintA->Initialize(mnodeA,  // node to connect
                            truss);  // body to be connected to

    sys.Add(constraintA);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(40);
    solver->SetTolerance(1e-10);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    GetLog() << "poss after linear static analysis: \n";
    GetLog() << "  nodeA->pos \n" << mnodeA->GetPos();
    GetLog() << "  nodeB->pos \n" << mnodeB->GetPos();
    GetLog() << "Forces after linear static analysis: \n";
    GetLog() << "  constraintA.react \n" << constraintA->GetReactionOnBody();
}